

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<int>::AddForwardIterator<int*>
          (RepeatedField<int> *this,int *begin,int *end)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool is_soo;
  int new_size;
  bool is_soo_00;
  char *local_50;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,is_soo_00);
  iVar3 = 2;
  if ((uVar1 & 4) == 0) {
    local_50 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  else {
    iVar3 = (this->soo_rep_).field_0.long_rep.capacity;
    local_50 = protobuf::internal::LongSooRep::elements((LongSooRep *)this);
  }
  new_size = (int)((ulong)((long)end - (long)begin) >> 2) + iVar2;
  iVar4 = iVar3;
  if (iVar3 < new_size) {
    Grow(this,(uVar1 & 4) == 0,iVar2,new_size);
    local_50 = protobuf::internal::LongSooRep::elements((LongSooRep *)this);
    iVar4 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  is_soo = new_size <= iVar3 && is_soo_00;
  iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,is_soo);
  if ((iVar2 != new_size) &&
     ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)this);
  }
  set_size(this,is_soo,new_size);
  if (end != begin) {
    memcpy(local_50 + (long)iVar2 * 4,begin,(long)end - (long)begin);
  }
  if (is_soo != ((undefined1  [16])
                 ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                (undefined1  [16])0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x38e);
  }
  iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,is_soo);
  if (new_size != iVar2) {
    protobuf::internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x390);
  }
  if (iVar3 < new_size || !is_soo_00) {
    pcVar5 = protobuf::internal::LongSooRep::elements((LongSooRep *)this);
  }
  else {
    pcVar5 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  if (local_50 != pcVar5) {
    protobuf::internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x392);
  }
  iVar2 = 2;
  if (new_size > iVar3 || !is_soo_00) {
    iVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar4 != iVar2) {
    protobuf::internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x394);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::AddForwardIterator(Iter begin, Iter end) {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  int capacity = Capacity(is_soo);
  Element* elem = unsafe_elements(is_soo);
  int new_size = old_size + static_cast<int>(std::distance(begin, end));
  if (ABSL_PREDICT_FALSE(new_size > capacity)) {
    Grow(is_soo, old_size, new_size);
    is_soo = false;
    elem = unsafe_elements(is_soo);
    capacity = Capacity(is_soo);
  }
  UninitializedCopy(begin, end, elem + ExchangeCurrentSize(is_soo, new_size));

  // The below helps the compiler optimize dense loops.
  // Note: we can't call functions in PROTOBUF_ASSUME so use local variables.
  [[maybe_unused]] const bool final_is_soo = this->is_soo();
  PROTOBUF_ASSUME(is_soo == final_is_soo);
  [[maybe_unused]] const int final_size = size(is_soo);
  PROTOBUF_ASSUME(new_size == final_size);
  [[maybe_unused]] Element* const final_elements = unsafe_elements(is_soo);
  PROTOBUF_ASSUME(elem == final_elements);
  [[maybe_unused]] const int final_capacity = Capacity(is_soo);
  PROTOBUF_ASSUME(capacity == final_capacity);
}